

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O2

void vigra::map_multiband<unsigned_char,unsigned_short>
               (void_vector<unsigned_short> *dest,uint *dest_bands,void_vector<unsigned_char> *src,
               uint src_bands,uint src_width,uint src_height,void_vector<unsigned_short> *maps,
               uint map_bands,uint map_width,uint map_height)

{
  value_type_conflict3 vVar1;
  uint i;
  uint uVar2;
  ulong uVar3;
  uint i_1;
  uint uVar4;
  ulong uVar5;
  uint bandnum_1;
  uint band;
  long lVar6;
  uint uVar7;
  colormap<unsigned_char,_unsigned_short> local_58;
  
  throw_precondition_error
            (src_bands == 1,"map_multiband(): Source image must have one band.",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx",
             0x108);
  uVar7 = src_width * src_height;
  colormap<unsigned_char,_unsigned_short>::colormap(&local_58,map_height,map_bands,map_width);
  uVar4 = 0;
  for (uVar3 = 0; map_bands != uVar3; uVar3 = uVar3 + 1) {
    colormap<unsigned_char,_unsigned_short>::initialize
              (&local_58,
               (value_type_conflict3 *)
               ((ulong)uVar4 * 2 + (long)(maps->super_void_vector_base).m_data),(uint)uVar3);
    uVar4 = uVar4 + map_height * map_width;
  }
  *dest_bands = map_bands * map_width;
  void_vector<unsigned_short>::resize(dest,(ulong)(map_bands * map_width * uVar7));
  uVar3 = (ulong)uVar7;
  if (map_width < 2) {
    uVar4 = 0;
    for (band = 0; uVar5 = uVar3, uVar2 = uVar4, band < *dest_bands; band = band + 1) {
      while (uVar5 != 0) {
        vVar1 = colormap<unsigned_char,_unsigned_short>::operator()
                          (&local_58,
                           *(domain_type *)
                            ((long)(src->super_void_vector_base).m_data + (ulong)uVar2),band);
        *(value_type_conflict3 *)((long)(dest->super_void_vector_base).m_data + (ulong)uVar2 * 2) =
             vVar1;
        uVar5 = uVar5 - 1;
        uVar2 = uVar2 + 1;
      }
      uVar4 = uVar4 + uVar7;
    }
  }
  else {
    lVar6 = 0;
    for (uVar4 = 0; uVar4 < *dest_bands; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        vVar1 = colormap<unsigned_char,_unsigned_short>::operator()
                          (&local_58,
                           *(domain_type *)((long)(src->super_void_vector_base).m_data + uVar5),
                           uVar4);
        *(value_type_conflict3 *)
         ((long)(dest->super_void_vector_base).m_data + (ulong)(uint)((int)uVar5 + (int)lVar6) * 2)
             = vVar1;
      }
      lVar6 = lVar6 + uVar3;
    }
  }
  void_vector_base::~void_vector_base(&local_58.m_tables.super_void_vector_base);
  return;
}

Assistant:

void map_multiband( void_vector<map_storage_type> & dest,
                        unsigned int & dest_bands,
                        const void_vector<storage_type> & src,
                        unsigned int src_bands, unsigned int src_width, unsigned int src_height,
                        const void_vector<map_storage_type> & maps,
                        unsigned int map_bands, unsigned int map_width, unsigned int map_height )
    {
        vigra_precondition(src_bands == 1u,
               "map_multiband(): Source image must have one band.");

        typedef colormap< storage_type, map_storage_type > colormap_type;
        const unsigned int num_pixels = src_width * src_height;

        // build the color map
        const unsigned int map_band_size = map_width * map_height;
        colormap_type colormap( map_height, map_bands, map_width );
        for ( unsigned int i = 0; i < map_bands; ++i )
            colormap.initialize( maps.data() + map_band_size * i, i );

        // map each pixel
        const unsigned int band_size = src_width * src_height;
        dest_bands = map_bands * map_width;
        dest.resize( band_size * dest_bands );
        if ( map_width > 1 ) {
            // interleaved maps => there is only one band in the image
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[i], bandnum );
        } else {
            // non-interleaved bands => map can be used per band
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[ bandnum * band_size + i ], bandnum );
        }
    }